

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

velocity3 * argagg::convert::arg<velocity3>(char *s)

{
  bool bVar1;
  velocity3 *in_RDI;
  char *local_10;
  
  in_RDI->x = 0.0;
  in_RDI->y = 0.0;
  in_RDI->z = 0.0;
  bVar1 = parse_next_component<double>(&local_10,&in_RDI->x,'+');
  if (bVar1) {
    bVar1 = parse_next_component<double>(&local_10,&in_RDI->y,'+');
    if (bVar1) {
      parse_next_component<double>(&local_10,&in_RDI->z,'+');
    }
  }
  return in_RDI;
}

Assistant:

velocity3 arg(const char* s)
  {
    velocity3 result {0.0, 0.0, 0.0};
    if (!parse_next_component(s, result.x, '+')) {
      // could potentially throw an error if you require that at least two
      // components exist in the list
      return result;
    }
    if (!parse_next_component(s, result.y, '+')) {
      return result;
    }
    if (!parse_next_component(s, result.z, '+')) {
      return result;
    }
    return result;
  }